

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.h
# Opt level: O1

void __thiscall SampleMuxerMetadata::SortableCue::~SortableCue(SortableCue *this)

{
  pointer pcVar1;
  
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->cue).payload.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::__cxx11::_List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::_M_clear
            (&(this->cue).settings.
              super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>);
  pcVar1 = (this->cue).identifier._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->cue).identifier.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

bool operator>(int64_t time_ns) const {
      // Cue start time expressed in milliseconds
      const int64_t start_ms = cue.start_time.presentation();

      // Cue start time expressed in nanoseconds (MKV time)
      const int64_t start_ns = start_ms * 1000000;

      return (start_ns > time_ns);
    }